

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::setCursorTrack(PatternModel *this,int track)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (this->mCursor).super_PatternCursorBase.track;
  if (uVar1 != track) {
    if (this->mWrapCursor == true) {
      if (track < 0) {
        uVar2 = 4 - (-track & 3U);
      }
      else {
        uVar2 = track & 3;
      }
    }
    else {
      uVar3 = 3;
      if ((uint)track < 3) {
        uVar3 = track;
      }
      uVar2 = 0;
      if (-1 < track) {
        uVar2 = uVar3;
      }
    }
    if (uVar2 != uVar1) {
      (this->mCursor).super_PatternCursorBase.track = uVar2;
      cursorChanged(this,(CursorChangeFlags)0x4);
      return;
    }
  }
  return;
}

Assistant:

void PatternModel::setCursorTrackImpl(int track, CursorChangeFlags &flags) {
    if (mCursor.track == track) {
        return;
    }

    if (mWrapCursor) {
        if (track < 0) {
            track = PatternCursor::MAX_TRACKS - (-track % PatternCursor::MAX_TRACKS);
        } else if (track > 3) {
            track %= PatternCursor::MAX_TRACKS;
        }
    } else {
        track = std::clamp(track, 0, PatternCursor::MAX_TRACKS - 1);
    }

    if (track != mCursor.track) {
        mCursor.track = track;
        flags |= CursorTrackChanged;
    }
}